

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

string_t __thiscall
duckdb::WindowQuantileState<duckdb::string_t>::WindowScalar<duckdb::string_t,true>
          (WindowQuantileState<duckdb::string_t> *this,CursorType *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  vector<std::pair<unsigned_long,_duckdb::string_t>,_true> *dest;
  Vector *vector;
  char *pcVar1;
  pointer this_00;
  pointer pHVar2;
  idx_t index;
  reference pvVar3;
  InternalException *this_01;
  ulong uVar4;
  anon_union_16_2_67f50693_for_value aVar5;
  string_t data_00;
  string local_50;
  
  if ((QuantileSortTree *)
      (this->qst).
      super_unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
      .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false> != (QuantileSortTree *)0x0) {
    this_00 = unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
              ::operator->(&this->qst);
    aVar5.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         QuantileSortTree::WindowScalar<duckdb::string_t,duckdb::string_t,true>
                   (this_00,data,frames,n,result,q);
    return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar5.pointer;
  }
  if ((this->s).
      super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>_>_>
      .
      super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>_*,_false>
      ._M_head_impl !=
      (HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>
       *)0x0) {
    pHVar2 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>_>,_true>
             ::operator->(&this->s);
    index = Interpolator<true>::Index(q,pHVar2->_count);
    pHVar2 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>_>,_true>
             ::operator->(&this->s);
    dest = &this->skips;
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_duckdb::string_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::string_t>_>_>
    ::at(pHVar2,index,1,
         &dest->
          super_vector<std::pair<unsigned_long,_duckdb::string_t>,_std::allocator<std::pair<unsigned_long,_duckdb::string_t>_>_>
        );
    pvVar3 = vector<std::pair<unsigned_long,_duckdb::string_t>,_true>::operator[](dest,0);
    vector = *(Vector **)&(pvVar3->second).value;
    pcVar1 = (pvVar3->second).value.pointer.ptr;
    uVar4 = ((long)(this->skips).
                   super_vector<std::pair<unsigned_long,_duckdb::string_t>,_std::allocator<std::pair<unsigned_long,_duckdb::string_t>_>_>
                   .
                   super__Vector_base<std::pair<unsigned_long,_duckdb::string_t>,_std::allocator<std::pair<unsigned_long,_duckdb::string_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->skips).
                   super_vector<std::pair<unsigned_long,_duckdb::string_t>,_std::allocator<std::pair<unsigned_long,_duckdb::string_t>_>_>
                   .
                   super__Vector_base<std::pair<unsigned_long,_duckdb::string_t>,_std::allocator<std::pair<unsigned_long,_duckdb::string_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    vector<std::pair<unsigned_long,_duckdb::string_t>,_true>::operator[](dest,(ulong)(1 < uVar4));
    data_00.value.pointer.ptr = (char *)uVar4;
    data_00.value._0_8_ = pcVar1;
    aVar5.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::AddStringOrBlob((StringVector *)result,vector,data_00);
    return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar5.pointer;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"No accelerator for scalar QUANTILE","");
  InternalException::InternalException(this_01,&local_50);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}